

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O0

PsbtOutputDataStruct *
cfd::js::api::PsbtStructApi::CombinePsbt
          (PsbtOutputDataStruct *__return_storage_ptr__,PsbtListStruct *request)

{
  PsbtListStruct *this;
  string *in_R8;
  allocator local_149;
  function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)> local_148;
  undefined1 local_128 [270];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  PsbtListStruct *pPStack_18;
  anon_class_1_0_00000001 call_func;
  PsbtListStruct *request_local;
  PsbtOutputDataStruct *result;
  
  local_1a = 0;
  pPStack_18 = request;
  PsbtOutputDataStruct::PsbtOutputDataStruct(__return_storage_ptr__);
  this = pPStack_18;
  std::function<cfd::js::api::PsbtOutputDataStruct(cfd::js::api::PsbtListStruct_const&)>::
  function<cfd::js::api::PsbtStructApi::CombinePsbt(cfd::js::api::PsbtListStruct_const&)::__0&,void>
            ((function<cfd::js::api::PsbtOutputDataStruct(cfd::js::api::PsbtListStruct_const&)> *)
             local_128,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"CombinePsbt",&local_149);
  ExecuteStructApi<cfd::js::api::PsbtListStruct,cfd::js::api::PsbtOutputDataStruct>
            ((PsbtOutputDataStruct *)(local_128 + 0x20),(api *)this,(PsbtListStruct *)local_128,
             &local_148,in_R8);
  PsbtOutputDataStruct::operator=(__return_storage_ptr__,(PsbtOutputDataStruct *)(local_128 + 0x20))
  ;
  PsbtOutputDataStruct::~PsbtOutputDataStruct((PsbtOutputDataStruct *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)>::
  ~function((function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::PsbtListStruct_&)> *)
            local_128);
  return __return_storage_ptr__;
}

Assistant:

PsbtOutputDataStruct PsbtStructApi::CombinePsbt(
    const PsbtListStruct& request) {
  auto call_func =
      [](const PsbtListStruct& request) -> PsbtOutputDataStruct {  // NOLINT
    if (request.psbts.empty()) {
      warn(CFD_LOG_SOURCE, "psbt list is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "psbt list is empty.");
    }
    Psbt psbt;
    GetPsbtFromString(request.psbts.at(0), "CombinePsbt", &psbt);

    for (size_t index = 1; index < request.psbts.size(); ++index) {
      Psbt append_psbt;
      GetPsbtFromString(request.psbts.at(index), "CombinePsbt", &append_psbt);
      psbt.Combine(append_psbt);
    }

    PsbtOutputDataStruct response;
    response.psbt = psbt.GetBase64();
    response.hex = psbt.GetData().GetHex();
    return response;
  };

  PsbtOutputDataStruct result;
  result = ExecuteStructApi<PsbtListStruct, PsbtOutputDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}